

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

Label * __thiscall wabt::anon_unknown_0::CWriter::FindLabel(CWriter *this,Var *var,bool mark_used)

{
  pointer pLVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  uint uVar4;
  Label *pLVar5;
  
  if (var->type_ == Name) {
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (int)((ulong)((long)(this->label_stack_).
                                super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) >> 4) *
            -0x55555555;
    if (uVar4 == 0) {
      pLVar5 = (Label *)0x0;
    }
    else {
      __s2 = (var->field_2).name_._M_dataplus._M_p;
      sVar2 = (var->field_2).name_._M_string_length;
      do {
        uVar4 = uVar4 - 1;
        pLVar5 = pLVar1 + uVar4;
        __n = (pLVar1[uVar4].name)->_M_string_length;
        if ((__n == sVar2) &&
           ((__n == 0 ||
            (iVar3 = bcmp(((pLVar1[uVar4].name)->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) break;
      } while (uVar4 != 0);
    }
  }
  else {
    if (var->type_ != Index) {
      __assert_fail("var.is_name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                    ,0x1e2,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
    pLVar5 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->label_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar5 >> 4) * -0x5555555555555555
        - (ulong)((var->field_2).index_ + 1) != 0) {
      __assert_fail("var.index() + 1 == label_stack_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                    ,0x1df,
                    "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)"
                   );
    }
  }
  if (pLVar5 == (Label *)0x0) {
    __assert_fail("label",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x1ea,
                  "const Label *wabt::(anonymous namespace)::CWriter::FindLabel(const Var &, bool)")
    ;
  }
  if (mark_used) {
    pLVar5->used = true;
  }
  return pLVar5;
}

Assistant:

const Label* CWriter::FindLabel(const Var& var, bool mark_used) {
  Label* label = nullptr;

  if (var.is_index()) {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    assert(var.index() + 1 == label_stack_.size());
    label = &label_stack_[0];
  } else {
    assert(var.is_name());
    for (Index i = label_stack_.size(); i > 0; --i) {
      label = &label_stack_[i - 1];
      if (label->name == var.name())
        break;
    }
  }

  assert(label);
  if (mark_used) {
    label->used = true;
  }
  return label;
}